

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O2

void __thiscall
cmInstallCommandArguments::cmInstallCommandArguments
          (cmInstallCommandArguments *this,string *defaultComponent)

{
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  static_string_view name_08;
  static_string_view name_09;
  
  (this->super_cmArgumentParser<void>).Bindings.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_cmArgumentParser<void>).Bindings.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_cmArgumentParser<void>).Bindings.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Destination)._M_dataplus._M_p = (pointer)&(this->Destination).field_2;
  (this->Destination)._M_string_length = 0;
  (this->Destination).field_2._M_local_buf[0] = '\0';
  (this->Component)._M_dataplus._M_p = (pointer)&(this->Component).field_2;
  (this->Component)._M_string_length = 0;
  (this->Component).field_2._M_local_buf[0] = '\0';
  (this->NamelinkComponent)._M_dataplus._M_p = (pointer)&(this->NamelinkComponent).field_2;
  (this->NamelinkComponent)._M_string_length = 0;
  (this->NamelinkComponent).field_2._M_local_buf[0] = '\0';
  this->ExcludeFromAll = false;
  (this->Rename)._M_dataplus._M_p = (pointer)&(this->Rename).field_2;
  (this->Rename)._M_string_length = 0;
  (this->Rename).field_2._M_local_buf[0] = '\0';
  (this->Permissions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Permissions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Permissions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Configurations).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Configurations).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Configurations).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   ((long)&(this->Configurations).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7) = 0;
  (this->Type)._M_dataplus._M_p = (pointer)&(this->Type).field_2;
  (this->Type)._M_string_length = 0;
  (this->Type).field_2._M_local_buf[0] = '\0';
  (this->DestinationString)._M_dataplus._M_p = (pointer)&(this->DestinationString).field_2;
  (this->DestinationString)._M_string_length = 0;
  (this->DestinationString).field_2._M_local_buf[0] = '\0';
  (this->PermissionsString)._M_dataplus._M_p = (pointer)&(this->PermissionsString).field_2;
  (this->PermissionsString)._M_string_length = 0;
  (this->PermissionsString).field_2._M_local_buf[0] = '\0';
  this->GenericArguments = (cmInstallCommandArguments *)0x0;
  std::__cxx11::string::string((string *)&this->DefaultComponentName,(string *)defaultComponent);
  name.super_string_view._M_str = "DESTINATION";
  name.super_string_view._M_len = 0xb;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,name,&this->Destination);
  name_00.super_string_view._M_str = "COMPONENT";
  name_00.super_string_view._M_len = 9;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,name_00,&this->Component);
  name_01.super_string_view._M_str = "NAMELINK_COMPONENT";
  name_01.super_string_view._M_len = 0x12;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,name_01,&this->NamelinkComponent);
  name_02.super_string_view._M_str = "EXCLUDE_FROM_ALL";
  name_02.super_string_view._M_len = 0x10;
  cmArgumentParser<void>::Bind<bool>
            (&this->super_cmArgumentParser<void>,name_02,&this->ExcludeFromAll);
  name_03.super_string_view._M_str = "RENAME";
  name_03.super_string_view._M_len = 6;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,name_03,&this->Rename);
  name_04.super_string_view._M_str = "PERMISSIONS";
  name_04.super_string_view._M_len = 0xb;
  cmArgumentParser<void>::
  Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&this->super_cmArgumentParser<void>,name_04,&this->Permissions);
  name_05.super_string_view._M_str = "CONFIGURATIONS";
  name_05.super_string_view._M_len = 0xe;
  cmArgumentParser<void>::
  Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&this->super_cmArgumentParser<void>,name_05,&this->Configurations);
  name_06.super_string_view._M_str = "OPTIONAL";
  name_06.super_string_view._M_len = 8;
  cmArgumentParser<void>::Bind<bool>(&this->super_cmArgumentParser<void>,name_06,&this->Optional);
  name_07.super_string_view._M_str = "NAMELINK_ONLY";
  name_07.super_string_view._M_len = 0xd;
  cmArgumentParser<void>::Bind<bool>
            (&this->super_cmArgumentParser<void>,name_07,&this->NamelinkOnly);
  name_08.super_string_view._M_str = "NAMELINK_SKIP";
  name_08.super_string_view._M_len = 0xd;
  cmArgumentParser<void>::Bind<bool>
            (&this->super_cmArgumentParser<void>,name_08,&this->NamelinkSkip);
  name_09.super_string_view._M_str = "TYPE";
  name_09.super_string_view._M_len = 4;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,name_09,&this->Type);
  return;
}

Assistant:

cmInstallCommandArguments::cmInstallCommandArguments(
  std::string defaultComponent)
  : DefaultComponentName(std::move(defaultComponent))
{
  this->Bind("DESTINATION"_s, this->Destination);
  this->Bind("COMPONENT"_s, this->Component);
  this->Bind("NAMELINK_COMPONENT"_s, this->NamelinkComponent);
  this->Bind("EXCLUDE_FROM_ALL"_s, this->ExcludeFromAll);
  this->Bind("RENAME"_s, this->Rename);
  this->Bind("PERMISSIONS"_s, this->Permissions);
  this->Bind("CONFIGURATIONS"_s, this->Configurations);
  this->Bind("OPTIONAL"_s, this->Optional);
  this->Bind("NAMELINK_ONLY"_s, this->NamelinkOnly);
  this->Bind("NAMELINK_SKIP"_s, this->NamelinkSkip);
  this->Bind("TYPE"_s, this->Type);
}